

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TPZFlopCounter>::Multiply
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *A,
          TPZFMatrix<TPZFlopCounter> *B,int opt)

{
  TPZBaseMatrix *pTVar1;
  TPZFMatrix<TPZFlopCounter> *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  ostream *poVar5;
  uint in_ECX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<TPZFlopCounter> *in_RDI;
  size_t in_stack_00000378;
  char *in_stack_00000380;
  TPZFMatrix<TPZFlopCounter> *in_stack_ffffffffffffffb0;
  double local_40;
  TPZFlopCounter local_38;
  double local_30;
  TPZFlopCounter local_28;
  uint local_1c;
  TPZBaseMatrix *local_18;
  TPZBaseMatrix *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_ECX == 0) {
    in_stack_ffffffffffffffb0 = (TPZFMatrix<TPZFlopCounter> *)TPZBaseMatrix::Rows(in_RDX);
    pTVar2 = (TPZFMatrix<TPZFlopCounter> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    if (in_stack_ffffffffffffffb0 == pTVar2) {
      iVar3 = TPZBaseMatrix::Cols(local_18);
      iVar4 = TPZBaseMatrix::Cols(local_10);
      if (iVar3 == iVar4) goto LAB_01305367;
    }
    pTVar1 = local_18;
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    iVar4 = TPZBaseMatrix::Cols(local_10);
    (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar1,iVar3,iVar4);
    goto LAB_01305467;
  }
LAB_01305367:
  if (local_1c == 0) {
LAB_01305408:
    if ((local_1c != 0) &&
       ((in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fDecomposed != '\0')) {
      std::operator<<((ostream *)&std::cerr,
                      "virtual void TPZMatrix<TPZFlopCounter>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = TPZFlopCounter]"
                     );
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "\nERROR: Cannot multiply with opt when matrix is decomposed");
      std::operator<<(poVar5,"\nAborting...\n");
      pzinternal::DebugStopImpl(in_stack_00000380,in_stack_00000378);
    }
  }
  else {
    iVar3 = TPZBaseMatrix::Rows(local_18);
    iVar4 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    if (iVar3 == iVar4) {
      iVar3 = TPZBaseMatrix::Cols(local_18);
      iVar4 = TPZBaseMatrix::Cols(local_10);
      if (iVar3 == iVar4) goto LAB_01305408;
    }
    pTVar1 = local_18;
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    iVar4 = TPZBaseMatrix::Cols(local_10);
    (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar1,iVar3,iVar4);
  }
LAB_01305467:
  switch((in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fDecomposed) {
  case '\0':
    local_30 = 1.0;
    TPZFlopCounter::TPZFlopCounter(&local_28,&local_30);
    local_40 = 0.0;
    TPZFlopCounter::TPZFlopCounter(&local_38,&local_40);
    (*(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x27])
              (local_28.fVal,local_38.fVal,in_RDI,local_10,local_18,local_18,(ulong)local_1c);
    break;
  case '\x01':
    TPZFMatrix<TPZFlopCounter>::operator=(in_RDI,in_stack_ffffffffffffffb0);
    (*(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x43])(in_RDI,local_18);
    break;
  default:
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZMatrix<TPZFlopCounter>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = TPZFlopCounter]"
                   );
    poVar5 = std::operator<<((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:");
    poVar5 = std::operator<<(poVar5,(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.
                                    fDecomposed);
    std::operator<<(poVar5,"\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000380,in_stack_00000378);
    break;
  case '\x03':
    TPZFMatrix<TPZFlopCounter>::operator=(in_RDI,in_stack_ffffffffffffffb0);
    (*(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x44])(in_RDI,local_18);
    (*(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x45])(in_RDI,local_18);
    break;
  case '\x04':
    TPZFMatrix<TPZFlopCounter>::operator=(in_RDI,in_stack_ffffffffffffffb0);
    (*(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x46])(in_RDI,local_18);
    (*(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x48])(in_RDI,local_18);
    (*(in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x47])(in_RDI,local_18);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}